

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void ra_append_range(roaring_array_t *ra,roaring_array_t *sa,int32_t start_index,int32_t end_index,
                    _Bool copy_on_write)

{
  int iVar1;
  container_t *pcVar2;
  int local_28;
  int32_t pos;
  int32_t i;
  _Bool copy_on_write_local;
  int32_t end_index_local;
  int32_t start_index_local;
  roaring_array_t *sa_local;
  roaring_array_t *ra_local;
  
  extend_array(ra,end_index - start_index);
  for (local_28 = start_index; local_28 < end_index; local_28 = local_28 + 1) {
    iVar1 = ra->size;
    ra->keys[iVar1] = sa->keys[local_28];
    if (copy_on_write) {
      pcVar2 = get_copy_of_container
                         (sa->containers[local_28],sa->typecodes + local_28,copy_on_write);
      sa->containers[local_28] = pcVar2;
      ra->containers[iVar1] = sa->containers[local_28];
      ra->typecodes[iVar1] = sa->typecodes[local_28];
    }
    else {
      pcVar2 = container_clone(sa->containers[local_28],sa->typecodes[local_28]);
      ra->containers[iVar1] = pcVar2;
      ra->typecodes[iVar1] = sa->typecodes[local_28];
    }
    ra->size = ra->size + 1;
  }
  return;
}

Assistant:

void ra_append_range(roaring_array_t *ra, roaring_array_t *sa,
                     int32_t start_index, int32_t end_index,
                     bool copy_on_write) {
    extend_array(ra, end_index - start_index);

    for (int32_t i = start_index; i < end_index; ++i) {
        const int32_t pos = ra->size;
        ra->keys[pos] = sa->keys[i];
        if (copy_on_write) {
            sa->containers[i] = get_copy_of_container(
                sa->containers[i], &sa->typecodes[i], copy_on_write);
            ra->containers[pos] = sa->containers[i];
            ra->typecodes[pos] = sa->typecodes[i];
        } else {
            ra->containers[pos] =
                container_clone(sa->containers[i], sa->typecodes[i]);
            ra->typecodes[pos] = sa->typecodes[i];
        }
        ra->size++;
    }
}